

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O3

void __thiscall
QWidgetPrivate::setStyle_helper(QWidgetPrivate *this,QStyle *newStyle,bool propagate)

{
  long *plVar1;
  QWidget *this_00;
  int *piVar2;
  Data *pDVar3;
  QArrayData *pQVar4;
  long lVar5;
  long lVar6;
  QWidgetPrivate *this_01;
  QStyle *pQVar7;
  Data *pDVar8;
  long lVar9;
  QStyleSheetStyle *this_02;
  long *plVar10;
  QWExtra *pQVar11;
  long lVar12;
  long in_FS_OFFSET;
  undefined1 *local_48;
  undefined1 *puStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QWidget **)&this->field_0x8;
  pQVar7 = QWidget::style(this_00);
  createExtra(this);
  pQVar11 = (this->extra)._M_t.super___uniq_ptr_impl<QWExtra,_std::default_delete<QWExtra>_>._M_t.
            super__Tuple_impl<0UL,_QWExtra_*,_std::default_delete<QWExtra>_>.
            super__Head_base<0UL,_QWExtra_*,_false>._M_head_impl;
  piVar2 = (int *)(pQVar11->style).wp.d;
  if (piVar2 != (int *)0x0) {
    LOCK();
    *piVar2 = *piVar2 + 1;
    UNLOCK();
    pQVar11 = (this->extra)._M_t.super___uniq_ptr_impl<QWExtra,_std::default_delete<QWExtra>_>._M_t.
              super__Tuple_impl<0UL,_QWExtra_*,_std::default_delete<QWExtra>_>.
              super__Head_base<0UL,_QWExtra_*,_false>._M_head_impl;
  }
  if (newStyle == (QStyle *)0x0) {
    pDVar8 = (Data *)0x0;
  }
  else {
    pDVar8 = (Data *)QtSharedPointer::ExternalRefCountData::getAndRef(&newStyle->super_QObject);
  }
  pDVar3 = (pQVar11->style).wp.d;
  (pQVar11->style).wp.d = pDVar8;
  (pQVar11->style).wp.value = &newStyle->super_QObject;
  if (pDVar3 != (Data *)0x0) {
    LOCK();
    *(int *)pDVar3 = *(int *)pDVar3 + -1;
    UNLOCK();
    if (*(int *)pDVar3 == 0) {
      operator_delete(pDVar3);
    }
  }
  if ((this->polished != (QMetaObject *)0x0) &&
     ((char)(this_00->data->window_flags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
            super_QFlagsStorage<Qt::WindowType>.i != '\x11')) {
    (**(code **)(*(long *)pQVar7 + 0x68))(pQVar7,this_00);
    pQVar7 = QWidget::style(this_00);
    (**(code **)(*(long *)pQVar7 + 0x60))(pQVar7,this_00);
  }
  if (propagate) {
    pQVar4 = *(QArrayData **)&this->field_0x18;
    lVar9 = *(long *)&this->field_0x20;
    lVar5 = *(long *)&this->field_0x28;
    if (pQVar4 != (QArrayData *)0x0) {
      LOCK();
      (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    if (lVar5 != 0) {
      lVar12 = 0;
      do {
        lVar6 = *(long *)(lVar9 + lVar12 * 8);
        if ((lVar6 != 0) &&
           (this_01 = *(QWidgetPrivate **)(lVar6 + 8), (this_01->field_0x30 & 1) != 0)) {
          inheritStyle(this_01);
        }
        lVar12 = lVar12 + 1;
      } while (lVar5 != lVar12);
    }
    if (pQVar4 != (QArrayData *)0x0) {
      LOCK();
      (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar4->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar4,8,0x10);
      }
    }
  }
  lVar9 = QMetaObject::cast((QObject *)&QStyleSheetStyle::staticMetaObject);
  if ((lVar9 == 0) &&
     (this_02 = (QStyleSheetStyle *)
                QMetaObject::cast((QObject *)&QStyleSheetStyle::staticMetaObject),
     this_02 != (QStyleSheetStyle *)0x0)) {
    QStyleSheetStyle::clearWidgetFont(this_02,this_00);
  }
  local_48 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
  QEvent::QEvent((QEvent *)&local_48,StyleChange);
  QCoreApplication::sendEvent(&this_00->super_QObject,(QEvent *)&local_48);
  plVar10 = (long *)QMetaObject::cast((QObject *)&QStyleSheetStyle::staticMetaObject);
  if (plVar10 != (long *)0x0) {
    plVar1 = plVar10 + 3;
    *(int *)plVar1 = (int)*plVar1 + -1;
    if ((int)*plVar1 == 0) {
      (**(code **)(*plVar10 + 0x20))(plVar10);
    }
  }
  QEvent::~QEvent((QEvent *)&local_48);
  if (piVar2 != (int *)0x0) {
    LOCK();
    *piVar2 = *piVar2 + -1;
    UNLOCK();
    if (*piVar2 == 0) {
      operator_delete(piVar2);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QWidgetPrivate::setStyle_helper(QStyle *newStyle, bool propagate)
{
    Q_Q(QWidget);
    QStyle *oldStyle = q->style();

    createExtra();

#ifndef QT_NO_STYLE_STYLESHEET
    QPointer<QStyle> origStyle = extra->style;
#endif
    extra->style = newStyle;

    // repolish
    if (polished && q->windowType() != Qt::Desktop) {
        oldStyle->unpolish(q);
        q->style()->polish(q);
    }

    if (propagate) {
        // We copy the list because the order may be modified
        const QObjectList childrenList = children;
        for (int i = 0; i < childrenList.size(); ++i) {
            QWidget *c = qobject_cast<QWidget*>(childrenList.at(i));
            if (c)
                c->d_func()->inheritStyle();
        }
    }

#ifndef QT_NO_STYLE_STYLESHEET
    if (!qt_styleSheet(newStyle)) {
        if (const QStyleSheetStyle* cssStyle = qt_styleSheet(origStyle)) {
            cssStyle->clearWidgetFont(q);
        }
    }
#endif

    QEvent e(QEvent::StyleChange);
    QCoreApplication::sendEvent(q, &e);

#ifndef QT_NO_STYLE_STYLESHEET
    // dereference the old stylesheet style
    if (QStyleSheetStyle *proxy = qt_styleSheet(origStyle))
        proxy->deref();
#endif
}